

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Element.cpp
# Opt level: O3

ElementPtr __thiscall Rml::Element::Clone(Element *this)

{
  String *instancer_name;
  XMLAttributes *attributes;
  Element *pEVar1;
  long *plVar2;
  NodePtr pDVar3;
  ElementMeta *pEVar4;
  ulong uVar5;
  ulong *puVar6;
  PropertyMap *this_00;
  ulong uVar7;
  long *in_RSI;
  pair<Rml::PropertyId,_Rml::Property> *id_property;
  NodePtr pDVar8;
  uint8_t *puVar9;
  ulong *puVar10;
  Element *this_01;
  const_iterator cVar11;
  String inner_rml;
  ElementAttributes clone_attributes;
  undefined1 local_68 [32];
  flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant,_itlib::fmimpl::less,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>_>
  local_48;
  
  (this->super_ScriptInterface).super_Releasable._vptr_Releasable = (_func_int **)0x0;
  plVar2 = (long *)in_RSI[0xf];
  instancer_name = (String *)(in_RSI + 7);
  attributes = (XMLAttributes *)(in_RSI + 0x14);
  if (plVar2 == (long *)0x0) {
    Factory::InstanceElement
              ((Factory *)local_68,(Element *)0x0,instancer_name,instancer_name,attributes);
    (this->super_ScriptInterface).super_Releasable._vptr_Releasable = (_func_int **)local_68._0_8_;
    if ((Element *)local_68._0_8_ == (Element *)0x0) {
      return (__uniq_ptr_data<Rml::Element,_Rml::Releaser<Rml::Element>,_true,_true>)
             (__uniq_ptr_data<Rml::Element,_Rml::Releaser<Rml::Element>,_true,_true>)this;
    }
  }
  else {
    (**(code **)(*plVar2 + 0x10))(local_68,plVar2,0,instancer_name,attributes);
    (this->super_ScriptInterface).super_Releasable._vptr_Releasable = (_func_int **)local_68._0_8_;
    if ((Element *)local_68._0_8_ == (Element *)0x0) {
      return (__uniq_ptr_data<Rml::Element,_Rml::Releaser<Rml::Element>,_true,_true>)
             (__uniq_ptr_data<Rml::Element,_Rml::Releaser<Rml::Element>,_true,_true>)this;
    }
    if (*(ElementInstancer **)(local_68._0_8_ + 0x78) == (ElementInstancer *)0x0) {
      *(ElementInstancer **)(local_68._0_8_ + 0x78) = (ElementInstancer *)in_RSI[0xf];
    }
  }
  this_01 = (Element *)local_68._0_8_;
  ::std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>
  ::vector(&local_48.m_container,
           (vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>
            *)attributes);
  itlib::
  flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant,_itlib::fmimpl::less,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>_>
  ::erase<char[6]>(&local_48,(char (*) [6])0x2da37c);
  itlib::
  flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant,_itlib::fmimpl::less,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>_>
  ::erase<char[6]>(&local_48,(char (*) [6])"class");
  SetAttributes(this_01,&local_48);
  this_00 = ElementStyle::GetLocalStyleProperties((ElementStyle *)(in_RSI[0x30] + 0x38));
  cVar11 = robin_hood::detail::
           Table<true,_80UL,_Rml::PropertyId,_Rml::Property,_robin_hood::hash<Rml::PropertyId,_void>,_std::equal_to<Rml::PropertyId>_>
           ::cbegin(this_00);
  pDVar3 = (NodePtr)this_00->mInfo;
  if (cVar11.mKeyVals != pDVar3) {
    do {
      puVar9 = cVar11.mInfo;
      pDVar8 = cVar11.mKeyVals;
      ElementStyle::SetProperty
                ((ElementStyle *)
                 ((this->super_ScriptInterface).super_Releasable._vptr_Releasable[0x30] + 0x38),
                 (pDVar8->mData).first,&(pDVar8->mData).second);
      pDVar8 = pDVar8 + 1;
      uVar7 = *(ulong *)(puVar9 + 1);
      if (uVar7 == 0) {
        puVar6 = (ulong *)(puVar9 + 9);
        do {
          puVar10 = puVar6;
          pDVar8 = pDVar8 + 8;
          uVar7 = *puVar10;
          puVar6 = puVar10 + 1;
        } while (uVar7 == 0);
      }
      else {
        puVar10 = (ulong *)(puVar9 + 1);
      }
      uVar5 = 0;
      if (uVar7 != 0) {
        for (; (uVar7 >> uVar5 & 1) == 0; uVar5 = uVar5 + 1) {
        }
      }
      uVar7 = uVar5 >> 3 & 0x1fffffff;
      cVar11.mInfo = (uint8_t *)((long)puVar10 + uVar7);
      cVar11.mKeyVals = pDVar8 + uVar7;
    } while (pDVar8 + uVar7 != pDVar3);
    this_01 = (Element *)(this->super_ScriptInterface).super_Releasable._vptr_Releasable;
  }
  pEVar4 = this_01->meta;
  ElementStyle::GetClassNames_abi_cxx11_((String *)local_68,(ElementStyle *)(in_RSI[0x30] + 0x38));
  ElementStyle::SetClassNames(&pEVar4->style,(String *)local_68);
  pEVar1 = (Element *)(local_68 + 0x10);
  if ((Element *)local_68._0_8_ != pEVar1) {
    operator_delete((void *)local_68._0_8_,CONCAT71(local_68._17_7_,local_68[0x10]) + 1);
  }
  local_68._8_8_ = 0;
  local_68[0x10] = '\0';
  local_68._0_8_ = pEVar1;
  (**(code **)(*in_RSI + 0x40))();
  SetInnerRML(this_01,(String *)local_68);
  if ((Element *)local_68._0_8_ != pEVar1) {
    operator_delete((void *)local_68._0_8_,CONCAT71(local_68._17_7_,local_68[0x10]) + 1);
  }
  ::std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>
  ::~vector(&local_48.m_container);
  return (__uniq_ptr_data<Rml::Element,_Rml::Releaser<Rml::Element>,_true,_true>)
         (__uniq_ptr_data<Rml::Element,_Rml::Releaser<Rml::Element>,_true,_true>)this;
}

Assistant:

ElementPtr Element::Clone() const
{
	ElementPtr clone;

	if (instancer)
	{
		clone = instancer->InstanceElement(nullptr, GetTagName(), attributes);
		if (clone)
			clone->SetInstancer(instancer);
	}
	else
		clone = Factory::InstanceElement(nullptr, GetTagName(), GetTagName(), attributes);

	if (clone)
	{
		// Copy over the attributes. The 'style' and 'class' attributes are skipped because inline styles and class names are copied manually below.
		// This is necessary in case any properties or classes have been set manually, in which case the 'style' and 'class' attributes are out of
		// sync with the used style and active classes.
		ElementAttributes clone_attributes = attributes;
		clone_attributes.erase("style");
		clone_attributes.erase("class");
		clone->SetAttributes(clone_attributes);

		for (auto& id_property : GetStyle()->GetLocalStyleProperties())
			clone->SetProperty(id_property.first, id_property.second);

		clone->GetStyle()->SetClassNames(GetStyle()->GetClassNames());

		String inner_rml;
		GetInnerRML(inner_rml);

		clone->SetInnerRML(inner_rml);
	}

	return clone;
}